

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void av1_lowbd_inv_txfm2d_add_h_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  transform_1d_ssse3 p_Var4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined2 uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  ulong *puVar29;
  int iVar30;
  longlong *plVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  undefined1 (*pauVar37) [16];
  long lVar38;
  int iVar39;
  undefined7 in_register_00000081;
  ulong uVar40;
  byte bVar41;
  uint uVar42;
  bool bVar43;
  __m128i scale_rounding;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined4 uVar47;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined4 uVar54;
  undefined1 auVar56 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined4 uVar77;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined4 uVar86;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  __m128i buf0 [64];
  longlong local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined2 auStack_41e [3];
  undefined8 local_418 [2];
  undefined4 local_408 [3];
  undefined2 uStack_3fa;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined2 auStack_3de [3];
  undefined8 local_3d8 [2];
  undefined4 local_3c8 [3];
  undefined2 uStack_3ba;
  undefined4 local_3b8 [226];
  undefined1 auVar48 [12];
  undefined1 auVar58 [16];
  undefined1 auVar57 [16];
  undefined1 auVar64 [16];
  undefined1 auVar63 [16];
  undefined1 auVar55 [12];
  undefined1 auVar59 [16];
  undefined1 auVar65 [16];
  undefined1 auVar60 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [12];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [12];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  
  uVar27 = CONCAT71(in_register_00000081,tx_size) & 0xffffffff;
  iVar2 = tx_size_wide[uVar27];
  iVar39 = 0x20;
  if (iVar2 < 0x20) {
    iVar39 = iVar2;
  }
  if (eob < iVar39) {
    iVar35 = eob_fill[eob + -1];
  }
  else {
    iVar35 = iVar39 + -1;
  }
  uVar40 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) * 4);
  iVar30 = *(int *)((long)tx_size_high + uVar40);
  uVar36 = iVar35 + 8 >> 3;
  iVar35 = 0x20;
  if (iVar30 < 0x20) {
    iVar35 = iVar30;
  }
  iVar34 = 0;
  if (iVar2 != iVar30) {
    if (iVar30 < iVar2) {
      iVar34 = 1;
      if ((iVar30 * 2 == iVar2) || (iVar34 = 2, iVar30 * 4 == iVar2)) goto LAB_003d179b;
    }
    else {
      iVar34 = -1;
      if ((iVar2 * 2 == iVar30) || (iVar34 = -2, iVar2 << 2 == iVar30)) goto LAB_003d179b;
    }
    iVar34 = 0;
  }
LAB_003d179b:
  if (0 < (int)uVar36) {
    pcVar3 = av1_inv_txfm_shift_ls[uVar27];
    iVar2 = *(int *)((long)tx_size_wide_log2 + uVar40);
    uVar42 = eob_fill[(eob + -1) / iVar39] + 8 >> 3;
    bVar41 = (byte)(tx_type - 4) >> 1;
    bVar43 = 5 < (byte)(bVar41 | tx_type << 7);
    bVar41 = 0x18 >> (bVar41 & 0x1f);
    p_Var4 = lowbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_high_log2 + uVar40) + -2]
             [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[eob_fill[(eob + -1) / iVar39]]];
    uVar40 = 0;
    uVar27 = (long)iVar30 - 1;
    if ((bVar41 & 1) != 0 || bVar43) {
      uVar27 = uVar40;
    }
    iVar39 = 1;
    if (1 < iVar30) {
      iVar39 = iVar30;
    }
    uVar33 = 0;
    do {
      if (0 < (int)uVar42) {
        pauVar28 = (undefined1 (*) [16])(input + (long)(int)uVar40 + 4);
        cVar1 = *pcVar3;
        auVar44._0_4_ =
             CONCAT22((short)((1 << (0xbU - cVar1 & 0x1f)) + 0x800),
                      (short)tx_size_high_log2[(long)iVar2 + 0x12]);
        auVar44._4_4_ = auVar44._0_4_;
        auVar44._8_4_ = auVar44._0_4_;
        auVar44._12_4_ = auVar44._0_4_;
        auVar45 = ZEXT416(0xc - (int)cVar1);
        plVar31 = &local_438;
        uVar32 = 0;
        do {
          if ((iVar34 == -1) || (iVar34 == 1)) {
            lVar38 = 0;
            pauVar37 = pauVar28;
            do {
              auVar49 = packssdw(pauVar37[-1],*pauVar37);
              auVar49 = pmulhrsw(auVar49,_DAT_0055f9f0);
              auVar60._0_12_ = auVar49._0_12_;
              auVar60._12_2_ = auVar49._6_2_;
              auVar60._14_2_ = 1;
              auVar59._12_4_ = auVar60._12_4_;
              auVar59._0_10_ = auVar49._0_10_;
              auVar59._10_2_ = 1;
              auVar58._10_6_ = auVar59._10_6_;
              auVar58._0_8_ = auVar49._0_8_;
              auVar58._8_2_ = auVar49._4_2_;
              auVar57._8_8_ = auVar58._8_8_;
              auVar57._0_8_ = 0x1000000000000;
              auVar56._6_10_ = auVar57._6_10_;
              auVar56._4_2_ = auVar49._2_2_;
              auVar56._0_2_ = auVar49._0_2_;
              auVar56._2_2_ = 1;
              auVar50._2_2_ = 0;
              auVar50._0_2_ = auVar49._8_2_;
              auVar50._4_2_ = auVar49._10_2_;
              auVar50._6_2_ = 0;
              auVar50._8_2_ = auVar49._12_2_;
              auVar50._10_2_ = 0;
              auVar50._12_2_ = auVar49._14_2_;
              auVar50._14_2_ = 1;
              auVar49 = pmaddwd(auVar56,auVar44);
              auVar61._0_4_ = auVar49._0_4_ >> auVar45;
              auVar61._4_4_ = auVar49._4_4_ >> auVar45;
              auVar61._8_4_ = auVar49._8_4_ >> auVar45;
              auVar61._12_4_ = auVar49._12_4_ >> auVar45;
              auVar49 = pmaddwd(auVar50,auVar44);
              auVar51._0_4_ = auVar49._0_4_ >> auVar45;
              auVar51._4_4_ = auVar49._4_4_ >> auVar45;
              auVar51._8_4_ = auVar49._8_4_ >> auVar45;
              auVar51._12_4_ = auVar49._12_4_ >> auVar45;
              auVar49 = packssdw(auVar61,auVar51);
              *(undefined1 (*) [16])((long)plVar31 + lVar38) = auVar49;
              lVar38 = lVar38 + 0x10;
              pauVar37 = (undefined1 (*) [16])(*pauVar37 + (long)iVar35 * 4);
            } while (lVar38 != 0x80);
          }
          else {
            lVar38 = 0;
            pauVar37 = pauVar28;
            do {
              auVar49 = packssdw(pauVar37[-1],*pauVar37);
              auVar66._0_12_ = auVar49._0_12_;
              auVar66._12_2_ = auVar49._6_2_;
              auVar66._14_2_ = 1;
              auVar65._12_4_ = auVar66._12_4_;
              auVar65._0_10_ = auVar49._0_10_;
              auVar65._10_2_ = 1;
              auVar64._10_6_ = auVar65._10_6_;
              auVar64._0_8_ = auVar49._0_8_;
              auVar64._8_2_ = auVar49._4_2_;
              auVar63._8_8_ = auVar64._8_8_;
              auVar63._0_8_ = 0x1000000000000;
              auVar62._6_10_ = auVar63._6_10_;
              auVar62._4_2_ = auVar49._2_2_;
              auVar62._0_2_ = auVar49._0_2_;
              auVar62._2_2_ = 1;
              auVar52._2_2_ = 0;
              auVar52._0_2_ = auVar49._8_2_;
              auVar52._4_2_ = auVar49._10_2_;
              auVar52._6_2_ = 0;
              auVar52._8_2_ = auVar49._12_2_;
              auVar52._10_2_ = 0;
              auVar52._12_2_ = auVar49._14_2_;
              auVar52._14_2_ = 1;
              auVar49 = pmaddwd(auVar62,auVar44);
              auVar67._0_4_ = auVar49._0_4_ >> auVar45;
              auVar67._4_4_ = auVar49._4_4_ >> auVar45;
              auVar67._8_4_ = auVar49._8_4_ >> auVar45;
              auVar67._12_4_ = auVar49._12_4_ >> auVar45;
              auVar49 = pmaddwd(auVar52,auVar44);
              auVar53._0_4_ = auVar49._0_4_ >> auVar45;
              auVar53._4_4_ = auVar49._4_4_ >> auVar45;
              auVar53._8_4_ = auVar49._8_4_ >> auVar45;
              auVar53._12_4_ = auVar49._12_4_ >> auVar45;
              auVar49 = packssdw(auVar67,auVar53);
              *(undefined1 (*) [16])((long)plVar31 + lVar38) = auVar49;
              lVar38 = lVar38 + 0x10;
              pauVar37 = (undefined1 (*) [16])(*pauVar37 + (long)iVar35 * 4);
            } while (lVar38 != 0x80);
          }
          lVar38 = uVar32 * 0x80;
          auVar49 = *(undefined1 (*) [16])(&local_438 + uVar32 * 0x10);
          auVar50 = *(undefined1 (*) [16])(local_418 + uVar32 * 0x10);
          auVar72._0_12_ = auVar49._0_12_;
          auVar72._12_2_ = auVar49._6_2_;
          auVar72._14_2_ = *(undefined2 *)((long)&local_428 + lVar38 + 6U);
          auVar71._12_4_ = auVar72._12_4_;
          auVar71._0_10_ = auVar49._0_10_;
          auVar71._10_2_ = *(undefined2 *)((long)&local_428 + lVar38 + 4U);
          auVar70._10_6_ = auVar71._10_6_;
          auVar70._0_8_ = auVar49._0_8_;
          auVar70._8_2_ = auVar49._4_2_;
          auVar20._4_8_ = auVar70._8_8_;
          auVar20._2_2_ = *(undefined2 *)((long)&local_428 + lVar38 + 2U);
          auVar20._0_2_ = auVar49._2_2_;
          auVar69._0_4_ = CONCAT22(*(undefined2 *)((long)&local_428 + uVar32 * 0x80),auVar49._0_2_);
          auVar69._4_12_ = auVar20;
          auVar84._0_12_ = auVar50._0_12_;
          auVar84._12_2_ = auVar50._6_2_;
          auVar84._14_2_ = *(undefined2 *)((long)local_408 + (uVar32 * 0x40 + 3) * 2);
          auVar83._12_4_ = auVar84._12_4_;
          auVar83._0_10_ = auVar50._0_10_;
          auVar83._10_2_ = *(undefined2 *)(local_408 + uVar32 * 0x20 + 1);
          auVar82._10_6_ = auVar83._10_6_;
          auVar82._0_8_ = auVar50._0_8_;
          auVar82._8_2_ = auVar50._4_2_;
          auVar21._4_8_ = auVar82._8_8_;
          auVar21._2_2_ = *(undefined2 *)((long)local_408 + (uVar32 * 0x40 + 1) * 2);
          auVar21._0_2_ = auVar50._2_2_;
          auVar51 = *(undefined1 (*) [16])(&local_3f8 + uVar32 * 0x10);
          auVar76._0_12_ = auVar51._0_12_;
          auVar76._12_2_ = auVar51._6_2_;
          auVar76._14_2_ = *(undefined2 *)((long)&local_3e8 + lVar38 + 6U);
          auVar75._12_4_ = auVar76._12_4_;
          auVar75._0_10_ = auVar51._0_10_;
          auVar75._10_2_ = *(undefined2 *)((long)&local_3e8 + lVar38 + 4U);
          auVar74._10_6_ = auVar75._10_6_;
          auVar74._0_8_ = auVar51._0_8_;
          auVar74._8_2_ = auVar51._4_2_;
          auVar22._4_8_ = auVar74._8_8_;
          auVar22._2_2_ = *(undefined2 *)((long)&local_3e8 + lVar38 + 2U);
          auVar22._0_2_ = auVar51._2_2_;
          auVar73._0_4_ = CONCAT22(*(undefined2 *)((long)&local_3e8 + uVar32 * 0x80),auVar51._0_2_);
          auVar73._4_12_ = auVar22;
          auVar60 = *(undefined1 (*) [16])(local_3d8 + uVar32 * 0x10);
          uVar19 = *(undefined2 *)(local_3c8 + uVar32 * 0x20);
          auVar92._0_12_ = auVar60._0_12_;
          auVar92._12_2_ = auVar60._6_2_;
          auVar92._14_2_ = *(undefined2 *)((long)local_3c8 + (uVar32 * 0x40 + 3) * 2);
          auVar91._12_4_ = auVar92._12_4_;
          auVar91._0_10_ = auVar60._0_10_;
          auVar91._10_2_ = *(undefined2 *)(local_3c8 + uVar32 * 0x20 + 1);
          auVar90._10_6_ = auVar91._10_6_;
          auVar90._0_8_ = auVar60._0_8_;
          auVar90._8_2_ = auVar60._4_2_;
          auVar23._4_8_ = auVar90._8_8_;
          auVar23._2_2_ = *(undefined2 *)((long)local_3c8 + (uVar32 * 0x40 + 1) * 2);
          auVar23._0_2_ = auVar60._2_2_;
          uVar47 = CONCAT22(*(undefined2 *)(local_418 + uVar32 * 0x10 + -1),auVar49._8_2_);
          auVar48._0_8_ =
               CONCAT26(*(undefined2 *)((long)local_418 + lVar38 + -6),
                        CONCAT24(auVar49._10_2_,uVar47));
          auVar48._8_2_ = auVar49._12_2_;
          auVar48._10_2_ = *(undefined2 *)((long)local_418 + (uVar32 * 0x20 + -1) * 4);
          auVar49._12_2_ = auVar49._14_2_;
          auVar49._0_12_ = auVar48;
          auVar49._14_2_ = *(undefined2 *)((long)local_418 + lVar38 + -2);
          uVar77 = CONCAT22(*(undefined2 *)(local_408 + uVar32 * 0x20 + 2),auVar50._8_2_);
          auVar78._0_8_ =
               CONCAT26(*(undefined2 *)((long)local_408 + (uVar32 * 0x40 + 5) * 2),
                        CONCAT24(auVar50._10_2_,uVar77));
          auVar78._8_2_ = auVar50._12_2_;
          auVar78._10_2_ = *(undefined2 *)((long)&stack0xfffffffffffffc04 + uVar32 * 0x20 * 4);
          auVar79._12_2_ = auVar50._14_2_;
          auVar79._0_12_ = auVar78;
          auVar79._14_2_ = (&uStack_3fa)[uVar32 * 0x40];
          uVar54 = CONCAT22(*(undefined2 *)(local_3d8 + uVar32 * 0x10 + -1),auVar51._8_2_);
          auVar55._0_8_ =
               CONCAT26(*(undefined2 *)((long)local_3d8 + lVar38 + -6),
                        CONCAT24(auVar51._10_2_,uVar54));
          auVar55._8_2_ = auVar51._12_2_;
          auVar55._10_2_ = *(undefined2 *)((long)local_3d8 + (uVar32 * 0x20 + -1) * 4);
          auVar68._12_2_ = auVar51._14_2_;
          auVar68._0_12_ = auVar55;
          auVar68._14_2_ = *(undefined2 *)((long)local_3d8 + lVar38 + -2);
          uVar86 = CONCAT22(*(undefined2 *)(local_3c8 + uVar32 * 0x20 + 2),auVar60._8_2_);
          auVar87._0_8_ =
               CONCAT26(*(undefined2 *)((long)local_3c8 + (uVar32 * 0x40 + 5) * 2),
                        CONCAT24(auVar60._10_2_,uVar86));
          auVar87._8_2_ = auVar60._12_2_;
          auVar87._10_2_ = *(undefined2 *)(local_3b8 + uVar32 * 0x20 + -1);
          auVar88._12_2_ = auVar60._14_2_;
          auVar88._0_12_ = auVar87;
          auVar88._14_2_ = *(undefined2 *)((long)local_3b8 + lVar38 + -2);
          auVar80._0_8_ = auVar69._0_8_;
          auVar80._8_4_ = auVar20._0_4_;
          auVar80._12_4_ = auVar21._0_4_;
          auVar81._0_8_ = auVar73._0_8_;
          auVar81._8_4_ = auVar22._0_4_;
          auVar81._12_4_ = auVar23._0_4_;
          auVar85._8_4_ = (int)((ulong)auVar48._0_8_ >> 0x20);
          auVar85._0_8_ = auVar48._0_8_;
          auVar85._12_4_ = (int)((ulong)auVar78._0_8_ >> 0x20);
          auVar89._8_4_ = (int)((ulong)auVar55._0_8_ >> 0x20);
          auVar89._0_8_ = auVar55._0_8_;
          auVar89._12_4_ = (int)((ulong)auVar87._0_8_ >> 0x20);
          *(ulong *)*(undefined1 (*) [16])(&local_438 + uVar32 * 0x10) =
               CONCAT44(CONCAT22(*(undefined2 *)(local_408 + uVar32 * 0x20),auVar50._0_2_),
                        auVar69._0_4_);
          (&uStack_430)[uVar32 * 0x10] = CONCAT44(CONCAT22(uVar19,auVar60._0_2_),auVar73._0_4_);
          *(long *)((long)&local_428 + uVar32 * 0x80) = auVar80._8_8_;
          local_418[uVar32 * 0x10 + -1] = auVar81._8_8_;
          *(int *)(local_418 + uVar32 * 0x10) = auVar70._8_4_;
          *(int *)((long)local_418 + (uVar32 * 0x20 + 1) * 4) = auVar82._8_4_;
          *(int *)(local_418 + uVar32 * 0x10 + 1) = auVar74._8_4_;
          local_408[uVar32 * 0x20 + -1] = auVar90._8_4_;
          local_408[uVar32 * 0x20 + 2] = auVar71._12_4_;
          *(undefined4 *)((long)&stack0xfffffffffffffc04 + uVar32 * 0x20 * 4) = auVar83._12_4_;
          *(undefined4 *)(&local_3f8 + uVar32 * 0x10) = auVar75._12_4_;
          *(undefined4 *)((long)&local_3f8 + lVar38 + 4) = auVar91._12_4_;
          (&local_3f8)[uVar32 * 0x10] = CONCAT44(uVar77,uVar47);
          (&uStack_3f0)[uVar32 * 0x10] = CONCAT44(uVar86,uVar54);
          *(long *)((long)&local_3e8 + uVar32 * 0x80) = auVar85._8_8_;
          local_3d8[uVar32 * 0x10 + -1] = auVar89._8_8_;
          *(int *)(local_3d8 + uVar32 * 0x10) = auVar48._8_4_;
          *(int *)((long)local_3d8 + (uVar32 * 0x20 + 1) * 4) = auVar78._8_4_;
          *(int *)(local_3d8 + uVar32 * 0x10 + 1) = auVar55._8_4_;
          local_3c8[uVar32 * 0x20 + -1] = auVar87._8_4_;
          local_3c8[uVar32 * 0x20 + 2] = auVar49._12_4_;
          local_3b8[uVar32 * 0x20 + -1] = auVar79._12_4_;
          local_3b8[uVar32 * 0x20] = auVar68._12_4_;
          local_3b8[uVar32 * 0x20 + 1] = auVar88._12_4_;
          uVar32 = uVar32 + 1;
          plVar31 = plVar31 + 0x10;
          pauVar28 = pauVar28 + 2;
        } while (uVar32 != uVar42);
      }
      (*p_Var4)((__m128i *)&local_438,(__m128i *)&local_438);
      auVar44 = ZEXT416((uint)(1 << (pcVar3[1] + 0xfU & 0x1f)));
      auVar44 = pshuflw(auVar44,auVar44,0);
      auVar45._0_4_ = auVar44._0_4_;
      auVar45._4_4_ = auVar45._0_4_;
      auVar45._8_4_ = auVar45._0_4_;
      auVar45._12_4_ = auVar45._0_4_;
      puVar29 = (ulong *)(output + uVar33 * 8);
      pauVar28 = (undefined1 (*) [16])(&local_438 + uVar27 * 2);
      iVar30 = iVar39;
      do {
        uVar32 = *puVar29;
        auVar13._8_6_ = 0;
        auVar13._0_8_ = uVar32;
        auVar13[0xe] = (char)(uVar32 >> 0x38);
        auVar14._8_4_ = 0;
        auVar14._0_8_ = uVar32;
        auVar14[0xc] = (char)(uVar32 >> 0x30);
        auVar14._13_2_ = auVar13._13_2_;
        auVar15._8_4_ = 0;
        auVar15._0_8_ = uVar32;
        auVar15._12_3_ = auVar14._12_3_;
        auVar16._8_2_ = 0;
        auVar16._0_8_ = uVar32;
        auVar16[10] = (char)(uVar32 >> 0x28);
        auVar16._11_4_ = auVar15._11_4_;
        auVar17._8_2_ = 0;
        auVar17._0_8_ = uVar32;
        auVar17._10_5_ = auVar16._10_5_;
        auVar18[8] = (char)(uVar32 >> 0x20);
        auVar18._0_8_ = uVar32;
        auVar18._9_6_ = auVar17._9_6_;
        auVar24._7_8_ = 0;
        auVar24._0_7_ = auVar18._8_7_;
        auVar25._1_8_ = SUB158(auVar24 << 0x40,7);
        auVar25[0] = (char)(uVar32 >> 0x18);
        auVar25._9_6_ = 0;
        auVar26._1_10_ = SUB1510(auVar25 << 0x30,5);
        auVar26[0] = (char)(uVar32 >> 0x10);
        auVar26._11_4_ = 0;
        auVar46._3_12_ = SUB1512(auVar26 << 0x20,3);
        auVar46[2] = (char)(uVar32 >> 8);
        auVar46[0] = (byte)uVar32;
        auVar46[1] = 0;
        auVar46[0xf] = 0;
        auVar44 = pmulhrsw(*pauVar28,auVar45);
        auVar44 = paddsw(auVar44,auVar46);
        sVar5 = auVar44._0_2_;
        sVar6 = auVar44._2_2_;
        sVar7 = auVar44._4_2_;
        sVar8 = auVar44._6_2_;
        sVar9 = auVar44._8_2_;
        sVar10 = auVar44._10_2_;
        sVar11 = auVar44._12_2_;
        sVar12 = auVar44._14_2_;
        *puVar29 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar44[0xe] - (0xff < sVar12),
                            CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar44[0xc] -
                                     (0xff < sVar11),
                                     CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar44[10] -
                                              (0xff < sVar10),
                                              CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar44[8] -
                                                       (0xff < sVar9),
                                                       CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                                auVar44[6] - (0xff < sVar8),
                                                                CONCAT12((0 < sVar7) *
                                                                         (sVar7 < 0x100) *
                                                                         auVar44[4] - (0xff < sVar7)
                                                                         ,CONCAT11((0 < sVar6) *
                                                                                   (sVar6 < 0x100) *
                                                                                   auVar44[2] -
                                                                                   (0xff < sVar6),
                                                                                   (0 < sVar5) *
                                                                                   (sVar5 < 0x100) *
                                                                                   auVar44[0] -
                                                                                   (0xff < sVar5))))
                                                      ))));
        puVar29 = (ulong *)((long)puVar29 + (long)stride);
        pauVar28 = (undefined1 (*) [16])(pauVar28[-1] + (((bVar41 | bVar43) & 1) << 5));
        iVar30 = iVar30 + -1;
      } while (iVar30 != 0);
      uVar33 = uVar33 + 1;
      uVar40 = (ulong)(uint)((int)uVar40 + iVar35 * 8);
    } while (uVar33 != uVar36);
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_h_identity_ssse3(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob) {
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  int eobx, eoby;
  get_eobx_eoby_scan_h_identity(&eobx, &eoby, tx_size, eob);
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = (eobx + 8) >> 3;
  const int buf_size_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx = lowbd_txfm_all_1d_zeros_idx[eoby];
  assert(fun_idx < 5);
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx];

  assert(col_txfm != NULL);

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_w_div8; i++) {
    __m128i buf0[64];
    for (int j = 0; j < buf_size_h_div8; j++) {
      __m128i *buf0_cur = buf0 + j * 8;
      const int32_t *input_cur = input + i * 8 * input_stride + j * 8;
      iidentity_row_8xn_ssse3(buf0_cur, input_cur, input_stride, shift[0], 8,
                              txw_idx, rect_type);
      transpose_16bit_8x8(buf0_cur, buf0_cur);
    }
    col_txfm(buf0, buf0);
    __m128i mshift = _mm_set1_epi16(1 << (15 + shift[1]));
    int k = ud_flip ? (txfm_size_row - 1) : 0;
    const int step = ud_flip ? -1 : 1;
    uint8_t *out = output + 8 * i;
    for (int j = 0; j < txfm_size_row; ++j, k += step) {
      const __m128i v = _mm_loadl_epi64((__m128i const *)(out));
      __m128i res = _mm_mulhrs_epi16(buf0[k], mshift);
      const __m128i u = lowbd_get_recon_8x8_sse2(v, res);
      _mm_storel_epi64((__m128i *)(out), u);
      out += stride;
    }
  }
}